

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O1

void select_none_cb(Fl_Widget *param_1,void *param_2)

{
  bool bVar1;
  Fl_Type *pFVar2;
  Fl_Type *pFVar3;
  Fl_Type *p;
  fd_set *in_R8;
  timeval *in_R9;
  
  if (Fl_Type::current == (Fl_Type *)0x0) {
    pFVar3 = (Fl_Type *)0x0;
  }
  else {
    pFVar3 = Fl_Type::current->parent;
  }
  p = pFVar3;
  if ((in_this_only != (Fl_Type *)0x0) &&
     (pFVar2 = pFVar3, p = in_this_only, pFVar3 != in_this_only && pFVar3 != (Fl_Type *)0x0)) {
    do {
      pFVar2 = pFVar2->parent;
      if (pFVar2 == (Fl_Type *)0x0) break;
    } while (pFVar2 != in_this_only);
    p = pFVar3;
    if (pFVar2 != in_this_only) {
      p = in_this_only;
    }
  }
  for (; p != (Fl_Type *)0x0; p = p->parent) {
    pFVar3 = p->next;
    if (pFVar3 == (Fl_Type *)0x0) {
      bVar1 = true;
    }
    else {
      bVar1 = false;
      do {
        if (pFVar3->level <= p->level) break;
        if (pFVar3->new_selected != '\0') {
          Fl_Browser_::select(&widget_browser->super_Fl_Browser_,(int)pFVar3,(fd_set *)0x0,
                              (fd_set *)0x0,in_R8,in_R9);
          bVar1 = true;
        }
        pFVar3 = pFVar3->next;
      } while (pFVar3 != (Fl_Type *)0x0);
      bVar1 = !bVar1;
    }
    if (!bVar1) goto LAB_001813c9;
  }
  p = (Fl_Type *)0x0;
  for (pFVar3 = Fl_Type::first; pFVar3 != (Fl_Type *)0x0; pFVar3 = pFVar3->next) {
    Fl_Browser_::select(&widget_browser->super_Fl_Browser_,(int)pFVar3,(fd_set *)0x0,(fd_set *)0x0,
                        in_R8,in_R9);
  }
LAB_001813c9:
  selection_changed(p);
  return;
}

Assistant:

void select_none_cb(Fl_Widget *,void *) {
  Fl_Type *p = Fl_Type::current ? Fl_Type::current->parent : 0;
  if (in_this_only) {
    Fl_Type *t = p;
    for (; t && t != in_this_only; t = t->parent) {/*empty*/}
    if (t != in_this_only) p = in_this_only;
  }
  for (;;) {
    if (p) {
      int foundany = 0;
      for (Fl_Type *t = p->next; t && t->level>p->level; t = t->next) {
	if (t->new_selected) {widget_browser->select(t,0,0); foundany = 1;}
      }
      if (foundany) break;
      p = p->parent;
    } else {
      for (Fl_Type *t = Fl_Type::first; t; t = t->next)
	widget_browser->select(t,0,0);
      break;
    }
  }
  selection_changed(p);
}